

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int main(void)

{
  ssize_t sVar1;
  size_t __nbytes;
  void *extraout_RDX;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  void *__buf_02;
  void *__buf_03;
  void *extraout_RDX_00;
  ifstream *ifs;
  IForReader iForReader;
  IIfAllReader iIfAllReader;
  IBlockReader iBlockReader;
  IWhileReader iWhileReader;
  ISentenceReader iSentenceReader;
  ofstream my_ofs;
  ifstream my_ifs;
  IAbstractReader local_5c0;
  IAbstractReader local_580;
  IBlockReader local_540;
  IWhileReader local_4f8;
  ISentenceReader local_498;
  long local_430;
  filebuf local_428 [240];
  ios_base local_338 [264];
  ifstream local_230 [520];
  
  std::ifstream::ifstream(local_230,"I:\\IDE\\CLion\\ICDecoder\\input.txt",_S_in);
  std::ofstream::ofstream(&local_430,"I:\\IDE\\CLion\\ICDecoder\\output.txt",_S_out);
  IIfAllReader::IIfAllReader((IIfAllReader *)&local_580,local_230,(ostream *)&local_430,0);
  IWhileReader::IWhileReader(&local_4f8,local_230,(ostream *)&local_430,0);
  IForReader::IForReader((IForReader *)&local_5c0,local_230,(ostream *)&local_430,0);
  IBlockReader::IBlockReader(&local_540,local_230,(ostream *)&local_430,0);
  ifs = local_230;
  __nbytes = 0;
  ISentenceReader::ISentenceReader(&local_498,ifs,(ostream *)&local_430,0,';');
  __buf = extraout_RDX;
  do {
    do {
      do {
        do {
          do {
            sVar1 = IAbstractReader::read(&local_5c0,(int)ifs,__buf,__nbytes);
            __buf = __buf_00;
          } while ((char)sVar1 != '\0');
          sVar1 = IAbstractReader::read((IAbstractReader *)&local_4f8,(int)ifs,__buf_00,__nbytes);
          __buf = __buf_01;
        } while ((char)sVar1 != '\0');
        sVar1 = IAbstractReader::read(&local_580,(int)ifs,__buf_01,__nbytes);
        __buf = __buf_02;
      } while ((char)sVar1 != '\0');
      sVar1 = IAbstractReader::read(&local_540.super_IAbstractReader,(int)ifs,__buf_02,__nbytes);
      __buf = __buf_03;
    } while ((char)sVar1 != '\0');
    sVar1 = IAbstractReader::read(&local_498.super_IAbstractReader,(int)ifs,__buf_03,__nbytes);
    __buf = extraout_RDX_00;
  } while ((char)sVar1 != '\0');
  std::ifstream::close();
  std::ofstream::close();
  local_498.super_IAbstractReader._vptr_IAbstractReader = (_func_int **)&PTR_getWord_00110a08;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_498.m_defining._M_dataplus._M_p != &local_498.m_defining.field_2) {
    operator_delete(local_498.m_defining._M_dataplus._M_p);
  }
  local_498.super_IAbstractReader._vptr_IAbstractReader =
       (_func_int **)&PTR___cxa_pure_virtual_001109d8;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_498.super_IAbstractReader.m_dataType._M_dataplus._M_p !=
      &local_498.super_IAbstractReader.m_dataType.field_2) {
    operator_delete(local_498.super_IAbstractReader.m_dataType._M_dataplus._M_p);
  }
  local_540.super_IAbstractReader._vptr_IAbstractReader =
       (_func_int **)&PTR___cxa_pure_virtual_001109d8;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_540.super_IAbstractReader.m_dataType._M_dataplus._M_p !=
      &local_540.super_IAbstractReader.m_dataType.field_2) {
    operator_delete(local_540.super_IAbstractReader.m_dataType._M_dataplus._M_p);
  }
  local_5c0._vptr_IAbstractReader = (_func_int **)&PTR___cxa_pure_virtual_001109d8;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5c0.m_dataType._M_dataplus._M_p != &local_5c0.m_dataType.field_2) {
    operator_delete(local_5c0.m_dataType._M_dataplus._M_p);
  }
  local_4f8.super_IBoolReader.super_IAbstractReader._vptr_IAbstractReader =
       (_func_int **)&PTR_getWord_00110c70;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4f8.super_IBoolReader.m_name._M_dataplus._M_p !=
      &local_4f8.super_IBoolReader.m_name.field_2) {
    operator_delete(local_4f8.super_IBoolReader.m_name._M_dataplus._M_p);
  }
  local_4f8.super_IBoolReader.super_IAbstractReader._vptr_IAbstractReader =
       (_func_int **)&PTR___cxa_pure_virtual_001109d8;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4f8.super_IBoolReader.super_IAbstractReader.m_dataType._M_dataplus._M_p !=
      &local_4f8.super_IBoolReader.super_IAbstractReader.m_dataType.field_2) {
    operator_delete(local_4f8.super_IBoolReader.super_IAbstractReader.m_dataType._M_dataplus._M_p);
  }
  local_580._vptr_IAbstractReader = (_func_int **)&PTR___cxa_pure_virtual_001109d8;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_580.m_dataType._M_dataplus._M_p != &local_580.m_dataType.field_2) {
    operator_delete(local_580.m_dataType._M_dataplus._M_p);
  }
  local_430 = _VTT;
  *(undefined8 *)(local_428 + *(long *)(_VTT + -0x18) + -8) = __filebuf;
  std::filebuf::~filebuf(local_428);
  std::ios_base::~ios_base(local_338);
  std::ifstream::~ifstream(local_230);
  return 0;
}

Assistant:

int main() {
    std::ifstream my_ifs(R"(I:\IDE\CLion\ICDecoder\input.txt)",std::ios_base::in);
    std::ofstream my_ofs(R"(I:\IDE\CLion\ICDecoder\output.txt)",std::ios_base::out);
    IIfAllReader iIfAllReader(&my_ifs, &my_ofs, 0);
    IWhileReader iWhileReader(&my_ifs, &my_ofs, 0);
    IForReader iForReader(&my_ifs, &my_ofs, 0);
    IBlockReader iBlockReader(&my_ifs, &my_ofs, 0);
    ISentenceReader iSentenceReader(&my_ifs, &my_ofs, 0);

    while(true)
    {
        if(iForReader.read());
        else if(iWhileReader.read());
        else if(iIfAllReader.read());
        else if(iBlockReader.read());
        else if(iSentenceReader.read());
        else break;
    }

    my_ifs.close();
    my_ofs.close();
    return 0;
}